

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_buffer.h
# Opt level: O3

StringBuffer * __thiscall MeCab::StringBuffer::operator<<(StringBuffer *this,uint n)

{
  byte bVar1;
  byte *pbVar2;
  StringBuffer *pSVar3;
  byte *pbVar4;
  byte *__n;
  byte *in_RDX;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  char fbuf [64];
  byte local_48 [72];
  
  uVar6 = (ulong)n;
  pbVar2 = local_48;
  __n = local_48;
  if (n == 0) {
    pbVar2 = local_48 + 1;
    local_48[0] = 0x30;
  }
  else {
    do {
      uVar5 = (uint)uVar6;
      in_RDX = (byte *)(uVar6 / 10);
      *pbVar2 = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
      pbVar2 = pbVar2 + 1;
      uVar6 = uVar6 / 10;
    } while (9 < uVar5);
  }
  *pbVar2 = 0;
  pbVar2 = pbVar2 + -1;
  if (local_48 < pbVar2) {
    pbVar4 = local_48 + 1;
    do {
      bVar1 = pbVar4[-1];
      pbVar4[-1] = *pbVar2;
      *pbVar2 = bVar1;
      pbVar2 = pbVar2 + -1;
      __n = pbVar4 + 1;
      bVar7 = pbVar4 < pbVar2;
      pbVar4 = __n;
      in_RDX = __n;
    } while (bVar7);
  }
  pSVar3 = (StringBuffer *)write(this,(int)local_48,in_RDX,(size_t)__n);
  return pSVar3;
}

Assistant:

StringBuffer& operator<<(unsigned int n)       { _UITOA(n); }